

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

bool __thiscall llvm::detail::IEEEFloat::isSignificandAllZeros(IEEEFloat *this)

{
  Significand *pSVar1;
  uint uVar2;
  ulong uVar3;
  uint i;
  ulong uVar4;
  Significand *pSVar5;
  
  uVar2 = this->semantics->precision;
  if (uVar2 - 0x40 < 0xffffff80) {
    pSVar5 = (Significand *)(this->significand).parts;
  }
  else {
    pSVar5 = &this->significand;
  }
  uVar3 = (ulong)((uVar2 + 0x40 >> 6) - 1);
  uVar4 = 0;
  do {
    if (uVar3 == uVar4) {
      uVar2 = ((uVar2 + 0x40 & 0xffffffc0) - uVar2) + 1;
      if (uVar2 < 0x41) {
        return pSVar5[uVar3].part << ((byte)uVar2 & 0x3f) == 0;
      }
      __assert_fail("NumHighBits <= integerPartWidth && \"Can not have more high bits to \" \"clear than integerPartWidth\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0x32a,"bool llvm::detail::IEEEFloat::isSignificandAllZeros() const");
    }
    pSVar1 = pSVar5 + uVar4;
    uVar4 = uVar4 + 1;
  } while (pSVar1->part == 0);
  return false;
}

Assistant:

bool IEEEFloat::isSignificandAllZeros() const {
  // Test if the significand excluding the integral bit is all zeros. This
  // allows us to test for binade boundaries.
  const integerPart *Parts = significandParts();
  const unsigned PartCount = partCount();

  for (unsigned i = 0; i < PartCount - 1; i++)
    if (Parts[i])
      return false;

  const unsigned NumHighBits =
    PartCount*integerPartWidth - semantics->precision + 1;
  assert(NumHighBits <= integerPartWidth && "Can not have more high bits to "
         "clear than integerPartWidth");
  const integerPart HighBitMask = ~integerPart(0) >> NumHighBits;

  if (Parts[PartCount - 1] & HighBitMask)
    return false;

  return true;
}